

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

AssertionResult *
iutest::internal::backward::NeHelper<false>::Compare<unsigned_long>
          (AssertionResult *__return_storage_ptr__,char *expr1,char *expr2,unsigned_long *val1,
          unsigned_long *val2)

{
  unsigned_long *val2_local;
  unsigned_long *val1_local;
  char *expr2_local;
  char *expr1_local;
  
  CmpHelper<unsigned_long,_true>::Compare(__return_storage_ptr__,expr1,expr2,val1,val2);
  return __return_storage_ptr__;
}

Assistant:

static AssertionResult Compare(const char* expr1, const char* expr2, const T& val1, const T& val2)
    {
        return CmpHelper<T, detail::has_not_equal_to<T>::value>::Compare(expr1, expr2, val1, val2);
    }